

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this,difference_type *x)

{
  ulong uVar1;
  long lVar2;
  view_pointer pVVar3;
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  reference piVar7;
  iterator iVar8;
  CoordinateOrder *pCVar9;
  reference pvVar10;
  difference_type *x_local;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  marray_detail::Assert<bool>(this->view_ != (view_pointer)0x0);
  uVar1 = this->index_;
  sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
  if (uVar1 < sVar5) {
    sVar5 = this->index_;
    lVar2 = *x;
    sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
    if (sVar5 + lVar2 < sVar6) {
      this->index_ = *x + this->index_;
      bVar4 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
      if (bVar4) {
        this->pointer_ = this->pointer_ + *x;
      }
      else {
        piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                           (this->view_,this->index_);
        this->pointer_ = piVar7;
        pVVar3 = this->view_;
        sVar5 = this->index_;
        iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          (&this->coordinates_);
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)pVVar3,sVar5,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )iVar8._M_current);
      }
    }
    else {
      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
      this->index_ = sVar5;
      bVar4 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
      if (bVar4) {
        piVar7 = View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)this->view_,0);
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
        this->pointer_ = piVar7 + sVar5;
      }
      else {
        this_00 = this->view_;
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
        piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()(this_00,sVar5 - 1);
        this->pointer_ = piVar7 + 1;
        pVVar3 = this->view_;
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
        iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          (&this->coordinates_);
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)pVVar3,sVar5 - 1,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )iVar8._M_current);
        pCVar9 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder(this->view_);
        if (*pCVar9 == LastMajorOrder) {
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->coordinates_,0);
          *pvVar10 = *pvVar10 + 1;
        }
        else {
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->coordinates_,sVar5 - 1);
          *pvVar10 = *pvVar10 + 1;
        }
      }
    }
  }
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator+=
(
    const difference_type& x
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        if(index_ + x < view_->size()) {
            index_ += x;
            if(view_->isSimple()) {
                pointer_ += x;
            }
            else {
                pointer_ = &((*view_)(index_));
                view_->indexToCoordinates(index_, coordinates_.begin());
            }
        }
        else {
            // set to end iterator
            index_ = view_->size();
            if(view_->isSimple()) {
                pointer_ = &(*view_)(0) + view_->size();
            }
            else {
                pointer_ = (&(*view_)(view_->size()-1)) + 1;
                view_->indexToCoordinates(view_->size()-1, coordinates_.begin());
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}